

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

uint64_t load_memop(void *haddr,MemOp op)

{
  int iVar1;
  uint uVar2;
  MemOp op_local;
  void *haddr_local;
  
  switch(op) {
  case MO_8:
    iVar1 = ldub_p(haddr);
    haddr_local = (void *)(long)iVar1;
    break;
  case MO_16:
    iVar1 = lduw_le_p(haddr);
    haddr_local = (void *)(long)iVar1;
    break;
  case MO_32:
    uVar2 = ldl_le_p(haddr);
    haddr_local = (void *)(ulong)uVar2;
    break;
  case MO_64:
    haddr_local = (void *)ldq_le_p(haddr);
    break;
  default:
    haddr_local = (void *)0x0;
    break;
  case MO_BEUW:
    iVar1 = lduw_be_p(haddr);
    haddr_local = (void *)(long)iVar1;
    break;
  case MO_BEUL:
    uVar2 = ldl_be_p(haddr);
    haddr_local = (void *)(ulong)uVar2;
    break;
  case MO_BEQ:
    haddr_local = (void *)ldq_be_p(haddr);
  }
  return (uint64_t)haddr_local;
}

Assistant:

static inline uint64_t
load_memop(const void *haddr, MemOp op)
{
    switch (op) {
    case MO_UB:
        return ldub_p(haddr);
    case MO_BEUW:
        return lduw_be_p(haddr);
    case MO_LEUW:
        return lduw_le_p(haddr);
    case MO_BEUL:
        return (uint32_t)ldl_be_p(haddr);
    case MO_LEUL:
        return (uint32_t)ldl_le_p(haddr);
    case MO_BEQ:
        return ldq_be_p(haddr);
    case MO_LEQ:
        return ldq_le_p(haddr);
    default:
        // qemu_build_not_reached();
        return 0;
    }
}